

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-sampling.cpp
# Opt level: O0

llama_sampler * llama_sampler_clone(llama_sampler *smpl)

{
  llama_sampler_i *in_RDI;
  llama_sampler_context_t in_stack_ffffffffffffffe8;
  llama_sampler *local_8;
  
  if (*(long *)(in_RDI->name + 0x20) == 0) {
    if (in_RDI->accept != (_func_void_llama_sampler_ptr_llama_token *)0x0) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-sampling.cpp"
                 ,0x16b,"the sampler does not support cloning");
    }
    local_8 = llama_sampler_init(in_RDI,in_stack_ffffffffffffffe8);
  }
  else {
    local_8 = (llama_sampler *)(**(code **)(in_RDI->name + 0x20))(in_RDI);
  }
  return local_8;
}

Assistant:

struct llama_sampler * llama_sampler_clone(const struct llama_sampler * smpl) {
    if (smpl->iface->clone) {
        return smpl->iface->clone(smpl);
    }

    if (smpl->ctx == nullptr) {
        return llama_sampler_init(
            /* .iface = */ smpl->iface,
            /* .ctx   = */ nullptr
        );
    }

    GGML_ABORT("the sampler does not support cloning");
}